

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

QString * __thiscall
Parser::resolveInclude(QString *__return_storage_ptr__,Parser *this,QString *filename)

{
  QSharedDataPointer<QFileInfoPrivate> QVar1;
  bool bVar2;
  QString *sp;
  QString *pQVar3;
  long lVar4;
  long in_FS_OFFSET;
  QFileInfo info;
  QString local_78;
  QSharedDataPointer<QFileInfoPrivate> local_60;
  QSharedDataPointer<QFileInfoPrivate> local_58;
  QStringBuilder<QStringBuilder<const_QString_&,_QLatin1Char>,_const_QString_&> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d.ptr = (totally_ordered_wrapper<QFileInfoPrivate_*>)&DAT_aaaaaaaaaaaaaaaa;
  QFileInfo::QFileInfo((QFileInfo *)&local_58,filename);
  bVar2 = QFileInfo::exists((QFileInfo *)&local_58);
  if (bVar2) {
LAB_0010b4eb:
    QFileInfo::absoluteFilePath(__return_storage_ptr__,(QFileInfo *)&local_58);
  }
  else {
    lVar4 = (this->m_includeDirs).d.size;
    if (lVar4 != 0) {
      pQVar3 = (this->m_includeDirs).d.ptr;
      lVar4 = lVar4 * 0x18;
      do {
        local_50.a.b.ch = '/';
        local_50.a.a = pQVar3;
        local_50.b = filename;
        QStringBuilder<QStringBuilder<const_QString_&,_QLatin1Char>,_const_QString_&>::
        convertTo<QString>(&local_78,&local_50);
        QFileInfo::QFileInfo((QFileInfo *)&local_60,&local_78);
        QVar1.d.ptr = local_58.d.ptr;
        local_58.d.ptr = local_60.d.ptr;
        local_60.d.ptr = QVar1.d.ptr;
        QFileInfo::~QFileInfo((QFileInfo *)&local_60);
        if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
          }
        }
        bVar2 = QFileInfo::exists((QFileInfo *)&local_58);
        if (bVar2) goto LAB_0010b4eb;
        pQVar3 = pQVar3 + 1;
        lVar4 = lVar4 + -0x18;
      } while (lVar4 != 0);
    }
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  QFileInfo::~QFileInfo((QFileInfo *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString Parser::resolveInclude(const QString &filename)
{
    QFileInfo info(filename);
    if (info.exists())
        return info.absoluteFilePath();
    for (const QString &sp : std::as_const(m_includeDirs)) {
        info = QFileInfo(sp + QLatin1Char('/') + filename);
        if (info.exists())
            return info.absoluteFilePath();
    }
    return {};
}